

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64.c
# Opt level: O1

void x86_64_arith2(dill_stream s,int op,int subop,int dest,int src)

{
  uint uVar1;
  uint uVar2;
  
  if (op != 0) {
    if (src != dest) {
      uVar1 = dest < 8 ^ 9;
      uVar2 = uVar1 + 4;
      if (src < 8) {
        uVar2 = uVar1;
      }
      BYTE_OUT2R(s,uVar2,0x89,(dest & 7U) + (src & 0x1fU) * 8 | 0xc0);
    }
    BYTE_OUT2R(s,dest < 8 ^ 9,op,(dest & 7U) + (subop & 0x1fU) * 8 | 0xc0);
    return;
  }
  uVar2 = 0;
  if (dest < 4) {
    uVar2 = dest;
  }
  BYTE_OUT3R(s,(7 < src) + 8,0x83,(src & 7U) + 0xf8,0);
  BYTE_OUT1IR(s,0,(uVar2 & 7) + 0xb8,0);
  BYTE_OUT3R(s,(uint)(7 < src) * 4 + 8,0xf,0x94,(uVar2 & 7) + 0xc0 + (src & 7U) * 8);
  if (dest < 4) {
    return;
  }
  x86_64_pmov(s,4,dest,uVar2);
  return;
}

Assistant:

extern void
x86_64_arith2(dill_stream s, int op, int subop, int dest, int src)
{
    if (op == 0) {
        int tmp_dest = dest;
        int rex1 = REX_W, rex2 = REX_W;
        /* must be not */
        if (dest >= ESP) {
            tmp_dest = EAX;
        }
        if (src > RDI)
            rex1 |= REX_B;
        BYTE_OUT3R(s, rex1, 0x83, ModRM(0x3, 0x7, src), 0); /* cmp */
        x86_64_seti(s, tmp_dest, 0);
        if (src > RDI)
            rex2 |= REX_R;
        if (tmp_dest > RDI)
            rex2 |= REX_B;
        BYTE_OUT3R(s, rex2, 0x0f, 0x94,
                   ModRM(0x3, src, tmp_dest)); /* sete dest */
        if (tmp_dest != dest) {
            x86_64_movi(s, dest, tmp_dest);
        }
    } else {
        int rex = REX_W;
        if (src != dest) {
            int rex1 = rex;
            if (dest > RDI)
                rex1 |= REX_B;
            if (src > RDI)
                rex1 |= REX_R;
            BYTE_OUT2R(s, rex1, MOV32, ModRM(0x3, src, dest));
        }
        if (dest > RDI)
            rex |= REX_B;
        BYTE_OUT2R(s, rex, op, ModRM(0x3, subop, dest));
    }
}